

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
* __thiscall
libtorrent::dht::dht_tracker::live_nodes
          (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           *__return_storage_ptr__,dht_tracker *this,node_id *nid)

{
  bool bVar1;
  pointer ppVar2;
  function<void_(const_libtorrent::dht::node_entry_&)> local_a8;
  anon_class_8_1_ba1d7401 local_88;
  function<void_(const_libtorrent::dht::node_entry_&)> local_80;
  _Self local_60 [3];
  node_id *local_48;
  _Base_ptr local_40;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  local_38;
  _Self local_30;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  n;
  node_id *nid_local;
  dht_tracker *this_local;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *ret;
  
  n._M_node._7_1_ = 0;
  std::
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::vector(__return_storage_ptr__);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
       ::begin(&this->m_nodes);
  local_40 = (_Base_ptr)
             std::
             map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
             ::end(&this->m_nodes);
  local_48 = nid;
  local_30._M_node =
       (_Base_ptr)
       std::
       find_if<std::_Rb_tree_iterator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>,libtorrent::dht::dht_tracker::live_nodes(libtorrent::digest32<160l>const&)::__1>
                 (local_38,(_Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
                            )local_40,(anon_class_8_1_ba1d6569_for__M_pred)nid);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
       ::end(&this->m_nodes);
  bVar1 = std::operator!=(&local_30,local_60);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator->(&local_30);
    local_88.ret = __return_storage_ptr__;
    std::function<void(libtorrent::dht::node_entry_const&)>::
    function<libtorrent::dht::dht_tracker::live_nodes(libtorrent::digest32<160l>const&)::__0,void>
              ((function<void(libtorrent::dht::node_entry_const&)> *)&local_80,&local_88);
    std::function<void_(const_libtorrent::dht::node_entry_&)>::function(&local_a8,(nullptr_t)0x0);
    routing_table::for_each_node(&(ppVar2->second).dht.m_table,&local_80,&local_a8);
    std::function<void_(const_libtorrent::dht::node_entry_&)>::~function(&local_a8);
    std::function<void_(const_libtorrent::dht::node_entry_&)>::~function(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<node_id, udp::endpoint>> dht_tracker::live_nodes(node_id const& nid)
	{
		std::vector<std::pair<node_id, udp::endpoint>> ret;

		auto n = std::find_if(m_nodes.begin(), m_nodes.end()
			, [&](tracker_nodes_t::value_type const& v) { return v.second.dht.nid() == nid; });

		if (n != m_nodes.end())
		{
			n->second.dht.m_table.for_each_node([&ret](node_entry const& e)
				{ ret.emplace_back(e.id, e.endpoint); }, nullptr);
		}

		return ret;
	}